

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

void __thiscall
pbrt::PortalImageInfiniteLight::PortalImageInfiniteLight
          (PortalImageInfiniteLight *this,Transform *renderFromLight,Image *equalAreaImage,
          RGBColorSpace *imageColorSpace,Float scale,string *filename,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *p,Allocator alloc)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_00;
  Point3<float> p_00;
  Point3<float> p_01;
  Point3<float> p_02;
  Point3<float> p_03;
  Point2<float> p2;
  Vector3<float> v_01;
  Vector3<float> v_02;
  Vector3<float> v_03;
  Vector3f y;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  Vector3f x;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Vector3<float> w;
  Vector3<float> v_04;
  Vector3<float> w_00;
  Vector3<float> v_05;
  Vector3<float> w_01;
  Vector3<float> v_06;
  Vector3<float> w_02;
  Vector3<float> v_07;
  Vector3<float> w_03;
  Vector3<float> v_08;
  Vector3<float> w_04;
  Vector3<float> v_09;
  bool bVar9;
  size_type sVar10;
  reference pvVar11;
  Point3<float> *pPVar12;
  Point3<float> *encoding;
  Tuple2<pbrt::Point2,_int> dxdA;
  Point2i PVar13;
  undefined8 in_RCX;
  Image *in_RDX;
  int iVar14;
  long in_RDI;
  string *this_00;
  string *in_R8;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *in_R9;
  undefined4 in_XMM0_Da;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined8 uVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  float fVar20;
  Vector3<float> VVar21;
  Tuple3<pbrt::Vector3,_float> TVar22;
  Tuple3<pbrt::Vector3,_float> TVar23;
  Image *in_stack_00000008;
  Array2D<float> d;
  anon_class_8_1_8991fb9c duv_dw;
  Vector3f p03;
  Vector3f p32;
  Vector3f p12;
  Vector3f p01;
  int i;
  size_t vb;
  int va;
  ImageChannelDesc channelDesc;
  Image *in_stack_fffffffffffff578;
  Image *pIVar24;
  Image *in_stack_fffffffffffff580;
  undefined4 in_stack_fffffffffffff588;
  LightType in_stack_fffffffffffff58c;
  LightBase *in_stack_fffffffffffff590;
  WindowedPiecewiseConstant2D *in_stack_fffffffffffff598;
  Allocator in_stack_fffffffffffff5a0;
  float in_stack_fffffffffffff5a8;
  float in_stack_fffffffffffff5ac;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffff5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5c0;
  char (*in_stack_fffffffffffff5c8) [19];
  float in_stack_fffffffffffff5d0;
  int in_stack_fffffffffffff5d4;
  char *in_stack_fffffffffffff5d8;
  undefined8 in_stack_fffffffffffff5e0;
  LogLevel level;
  char *in_stack_fffffffffffff5e8;
  string *psVar25;
  undefined8 in_stack_fffffffffffff5f0;
  LogLevel level_00;
  Image *in_stack_fffffffffffff5f8;
  Allocator in_stack_fffffffffffff600;
  int *in_stack_fffffffffffff608;
  char (*in_stack_fffffffffffff610) [19];
  Bounds2f *domain;
  unsigned_long *in_stack_fffffffffffff618;
  Image *this_01;
  Allocator alloc_00;
  float in_stack_fffffffffffff648;
  undefined4 in_stack_fffffffffffff658;
  undefined4 in_stack_fffffffffffff65c;
  undefined4 in_stack_fffffffffffff660;
  undefined4 in_stack_fffffffffffff664;
  size_t in_stack_fffffffffffff668;
  float fVar26;
  undefined4 uStack_98c;
  PixelFormat format;
  undefined4 in_stack_fffffffffffff6b0;
  size_t in_stack_fffffffffffff6c8;
  int in_stack_fffffffffffff6d0;
  string *local_7c8;
  int iStack_64c;
  allocator<char> local_633;
  undefined1 local_632;
  undefined1 local_631 [9];
  undefined1 local_628 [96];
  Half *local_5c8;
  size_t local_5c0;
  Tuple2<pbrt::Point2,_int> local_5a8;
  undefined8 local_508;
  float local_500;
  undefined8 local_4f8;
  float local_4f0;
  undefined8 local_4e8;
  float local_4e0;
  undefined8 local_4d8;
  float local_4d0;
  undefined8 local_4cc;
  undefined8 uStack_4c4;
  undefined8 uStack_4bc;
  undefined8 uStack_4b4;
  undefined4 local_4ac;
  undefined8 local_4a8;
  float local_4a0;
  undefined8 local_498;
  float local_490;
  undefined8 local_488;
  float local_480;
  undefined8 local_478;
  float local_470;
  undefined8 local_468;
  float local_460;
  undefined8 local_458;
  float local_450;
  undefined8 local_448;
  float local_440;
  undefined8 local_438;
  float local_430;
  undefined8 local_428;
  float local_420;
  undefined8 local_418;
  float local_410;
  undefined8 local_408;
  float local_400;
  undefined8 local_3f8;
  float local_3f0;
  undefined8 local_3e8;
  float local_3e0;
  undefined8 local_3d8;
  float local_3d0;
  undefined8 local_3c8;
  float local_3c0;
  undefined8 local_3b8;
  float local_3b0;
  undefined8 local_3a8;
  float local_3a0;
  undefined8 local_398;
  float local_390;
  undefined8 local_388;
  float local_380;
  undefined8 local_378;
  float local_370;
  undefined8 local_368;
  float local_360;
  undefined8 local_358;
  float local_350;
  undefined8 local_348;
  float local_340;
  undefined8 local_338;
  float local_330;
  undefined8 local_328;
  float local_320;
  undefined8 local_318;
  float local_310;
  undefined8 local_308;
  float local_300;
  undefined8 local_2f8;
  float local_2f0;
  undefined8 local_2e8;
  float local_2e0;
  undefined8 local_2d8;
  float local_2d0;
  undefined8 local_2c8;
  float local_2c0;
  undefined8 local_2b8;
  float local_2b0;
  undefined8 local_2a8;
  float local_2a0;
  undefined8 local_298;
  float local_290;
  undefined8 local_288;
  float local_280;
  undefined8 local_278;
  float local_270;
  undefined8 local_268;
  float local_260;
  undefined8 local_258;
  float local_250;
  undefined8 local_248;
  float local_240;
  undefined8 local_238;
  float local_230;
  undefined8 local_228;
  float local_220;
  undefined8 local_218;
  float local_210;
  undefined8 local_208;
  float local_200;
  undefined8 local_1f8;
  float local_1f0;
  undefined8 local_1e8;
  float local_1e0;
  undefined8 local_1d8;
  float local_1d0;
  undefined8 local_1c8;
  float local_1c0;
  undefined8 local_1b8;
  float local_1b0;
  undefined8 local_1a8;
  float local_1a0;
  undefined8 local_198;
  float local_190;
  undefined8 local_188;
  float local_180;
  undefined8 local_178;
  float local_170;
  int local_16c;
  size_type local_168;
  Tuple2<pbrt::Point2,_int> local_160;
  Tuple2<pbrt::Point2,_int> local_158;
  Tuple2<pbrt::Point2,_int> local_150;
  Tuple2<pbrt::Point2,_int> local_148;
  size_t local_140;
  int local_138;
  undefined1 local_134;
  allocator<char> local_133;
  allocator<char> local_132;
  allocator<char> local_131;
  string *local_130;
  string local_128 [32];
  undefined1 local_108 [32];
  undefined1 local_e8 [32];
  string *local_c8;
  undefined8 local_c0;
  Image *local_68;
  Image *local_60;
  undefined1 local_58 [16];
  string *local_38;
  undefined4 local_2c;
  undefined8 local_28;
  Image *local_8;
  
  local_8 = in_stack_00000008;
  local_58 = (undefined1  [16])0x0;
  local_38 = in_R8;
  local_2c = in_XMM0_Da;
  local_28 = in_RCX;
  MediumInterface::MediumInterface((MediumInterface *)in_stack_fffffffffffff580);
  LightBase::LightBase
            (in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
             (Transform *)in_stack_fffffffffffff580,(MediumInterface *)in_stack_fffffffffffff578);
  pstd::array<pbrt::Point3<float>,_4>::array
            ((array<pbrt::Point3<float>,_4> *)in_stack_fffffffffffff590);
  Frame::Frame((Frame *)in_stack_fffffffffffff580);
  local_60 = local_8;
  Image::Image(in_stack_fffffffffffff5f8,in_stack_fffffffffffff600);
  local_68 = local_8;
  WindowedPiecewiseConstant2D::WindowedPiecewiseConstant2D
            (in_stack_fffffffffffff598,in_stack_fffffffffffff5a0);
  *(undefined8 *)(in_RDI + 0x1c8) = local_28;
  *(undefined4 *)(in_RDI + 0x1d0) = local_2c;
  std::__cxx11::string::string((string *)(in_RDI + 0x1d8),local_38);
  Point3<float>::Point3((Point3<float> *)0x8abcd0);
  local_134 = 1;
  local_130 = local_128;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5c0,(char *)in_stack_fffffffffffff5b8,
             (allocator<char> *)in_stack_fffffffffffff5b0);
  local_130 = (string *)local_108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5c0,(char *)in_stack_fffffffffffff5b8,
             (allocator<char> *)in_stack_fffffffffffff5b0);
  local_130 = (string *)local_e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5c0,(char *)in_stack_fffffffffffff5b8,
             (allocator<char> *)in_stack_fffffffffffff5b0);
  local_134 = 0;
  local_c8 = local_128;
  local_c0 = 3;
  v._M_array._4_4_ = in_stack_fffffffffffff58c;
  v._M_array._0_4_ = in_stack_fffffffffffff588;
  v._M_len = (size_type)in_stack_fffffffffffff590;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff580,v);
  requestedChannels.ptr._4_4_ = in_stack_fffffffffffff664;
  requestedChannels.ptr._0_4_ = in_stack_fffffffffffff660;
  requestedChannels.n = in_stack_fffffffffffff668;
  Image::GetChannelDesc
            ((Image *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
             requestedChannels);
  local_7c8 = (string *)&local_c8;
  do {
    local_7c8 = local_7c8 + -0x20;
    std::__cxx11::string::~string(local_7c8);
    level = (LogLevel)((ulong)in_stack_fffffffffffff5e0 >> 0x20);
    level_00 = (LogLevel)((ulong)in_stack_fffffffffffff5f0 >> 0x20);
  } while (local_7c8 != local_128);
  std::allocator<char>::~allocator(&local_133);
  std::allocator<char>::~allocator(&local_132);
  std::allocator<char>::~allocator(&local_131);
  bVar9 = ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x8abea9);
  if (!bVar9) {
    ErrorExit<std::__cxx11::string_const&>
              ((char *)in_stack_fffffffffffff5b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
  }
  local_138 = 3;
  local_140 = ImageChannelDesc::size((ImageChannelDesc *)0x8ac07b);
  if ((long)local_138 != local_140) {
    LogFatal<char_const(&)[2],char_const(&)[19],char_const(&)[2],int&,char_const(&)[19],unsigned_long&>
              (level_00,in_stack_fffffffffffff5e8,level,in_stack_fffffffffffff5d8,
               (char (*) [2])CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
               in_stack_fffffffffffff5c8,(char (*) [2])in_stack_fffffffffffff600.memoryResource,
               in_stack_fffffffffffff608,in_stack_fffffffffffff610,in_stack_fffffffffffff618);
  }
  bVar9 = ImageChannelDesc::IsIdentity
                    ((ImageChannelDesc *)
                     CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
  if (!bVar9) {
    LogFatal<char_const(&)[25]>
              (level,in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d4,*in_stack_fffffffffffff5c8,
               (char (*) [25])in_stack_fffffffffffff5c0);
  }
  local_148 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(in_RDX);
  iVar14 = local_148.x;
  local_150 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(in_RDX);
  if (iVar14 != local_150.y) {
    local_158 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(in_RDX);
    local_160 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(in_RDX);
    ErrorExit<std::__cxx11::string_const&,int,int>
              ((char *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
               (int *)in_stack_fffffffffffff5b0,
               (int *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
  }
  sVar10 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size(in_R9);
  if (sVar10 != 4) {
    local_168 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size(in_R9)
    ;
    ErrorExit<unsigned_long>
              ((char *)in_stack_fffffffffffff5b0,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
  }
  for (local_16c = 0; local_16c < 4; local_16c = local_16c + 1) {
    pvVar11 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                        (in_R9,(long)local_16c);
    pPVar12 = pstd::array<pbrt::Point3<float>,_4>::operator[]
                        ((array<pbrt::Point3<float>,_4> *)(in_RDI + 0x98),(long)local_16c);
    fVar15 = (pvVar11->super_Tuple3<pbrt::Point3,_float>).y;
    (pPVar12->super_Tuple3<pbrt::Point3,_float>).x = (pvVar11->super_Tuple3<pbrt::Point3,_float>).x;
    (pPVar12->super_Tuple3<pbrt::Point3,_float>).y = fVar15;
    (pPVar12->super_Tuple3<pbrt::Point3,_float>).z = (pvVar11->super_Tuple3<pbrt::Point3,_float>).z;
  }
  pstd::array<pbrt::Point3<float>,_4>::operator[]
            ((array<pbrt::Point3<float>,_4> *)(in_RDI + 0x98),1);
  pPVar12 = pstd::array<pbrt::Point3<float>,_4>::operator[]
                      ((array<pbrt::Point3<float>,_4> *)(in_RDI + 0x98),0);
  local_1a0 = (pPVar12->super_Tuple3<pbrt::Point3,_float>).z;
  local_1a8._0_4_ = (pPVar12->super_Tuple3<pbrt::Point3,_float>).x;
  local_1a8._4_4_ = (pPVar12->super_Tuple3<pbrt::Point3,_float>).y;
  uVar18 = 0;
  p_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff5a8;
  p_00.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_stack_fffffffffffff5a0.memoryResource;
  local_198 = local_1a8;
  local_190 = local_1a0;
  VVar21 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588)
                      ,p_00);
  local_1c0 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._8_8_ = uVar18;
  auVar8._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_1c8 = vmovlpd_avx(auVar8);
  uVar18 = 0;
  VVar21.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff5d0;
  VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff5c8;
  local_1b8 = local_1c8;
  local_1b0 = local_1c0;
  local_188 = local_1c8;
  local_180 = local_1c0;
  VVar21 = Normalize<float>(VVar21);
  local_1d0 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._8_8_ = uVar18;
  auVar7._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_1d8 = vmovlpd_avx(auVar7);
  local_178 = local_1d8;
  local_170 = local_1d0;
  pstd::array<pbrt::Point3<float>,_4>::operator[]
            ((array<pbrt::Point3<float>,_4> *)(in_RDI + 0x98),2);
  pPVar12 = pstd::array<pbrt::Point3<float>,_4>::operator[]
                      ((array<pbrt::Point3<float>,_4> *)(in_RDI + 0x98),1);
  local_210 = (pPVar12->super_Tuple3<pbrt::Point3,_float>).z;
  local_218._0_4_ = (pPVar12->super_Tuple3<pbrt::Point3,_float>).x;
  local_218._4_4_ = (pPVar12->super_Tuple3<pbrt::Point3,_float>).y;
  uVar18 = 0;
  p_01.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff5a8;
  p_01.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_stack_fffffffffffff5a0.memoryResource;
  local_208 = local_218;
  local_200 = local_210;
  VVar21 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588)
                      ,p_01);
  local_230 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._8_8_ = uVar18;
  auVar6._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_238 = vmovlpd_avx(auVar6);
  uVar18 = 0;
  v_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff5d0;
  v_01.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff5c8;
  local_228 = local_238;
  local_220 = local_230;
  local_1f8 = local_238;
  local_1f0 = local_230;
  VVar21 = Normalize<float>(v_01);
  local_240 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar5._8_8_ = uVar18;
  auVar5._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_248 = vmovlpd_avx(auVar5);
  local_1e8 = local_248;
  local_1e0 = local_240;
  pstd::array<pbrt::Point3<float>,_4>::operator[]
            ((array<pbrt::Point3<float>,_4> *)(in_RDI + 0x98),2);
  pPVar12 = pstd::array<pbrt::Point3<float>,_4>::operator[]
                      ((array<pbrt::Point3<float>,_4> *)(in_RDI + 0x98),3);
  local_280 = (pPVar12->super_Tuple3<pbrt::Point3,_float>).z;
  local_288._0_4_ = (pPVar12->super_Tuple3<pbrt::Point3,_float>).x;
  local_288._4_4_ = (pPVar12->super_Tuple3<pbrt::Point3,_float>).y;
  uVar18 = 0;
  p_02.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff5a8;
  p_02.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_stack_fffffffffffff5a0.memoryResource;
  local_278 = local_288;
  local_270 = local_280;
  VVar21 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588)
                      ,p_02);
  fVar20 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4._8_8_ = uVar18;
  auVar4._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_2a8 = vmovlpd_avx(auVar4);
  pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  v_02.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff5d0;
  v_02.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff5c8;
  local_2a0 = fVar20;
  local_298 = local_2a8;
  local_290 = fVar20;
  local_268 = local_2a8;
  local_260 = fVar20;
  TVar22 = (Tuple3<pbrt::Vector3,_float>)Normalize<float>(v_02);
  local_2b0 = TVar22.z;
  auVar3._8_8_ = pbVar19;
  auVar3._0_8_ = TVar22._0_8_;
  local_2b8 = vmovlpd_avx(auVar3);
  local_258 = local_2b8;
  local_250 = local_2b0;
  pPVar12 = pstd::array<pbrt::Point3<float>,_4>::operator[]
                      ((array<pbrt::Point3<float>,_4> *)(in_RDI + 0x98),3);
  encoding = pstd::array<pbrt::Point3<float>,_4>::operator[]
                       ((array<pbrt::Point3<float>,_4> *)(in_RDI + 0x98),0);
  iVar14 = (int)pPVar12;
  local_2f0 = (encoding->super_Tuple3<pbrt::Point3,_float>).z;
  local_2f8._0_4_ = (encoding->super_Tuple3<pbrt::Point3,_float>).x;
  local_2f8._4_4_ = (encoding->super_Tuple3<pbrt::Point3,_float>).y;
  uVar18 = 0;
  p_03.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff5a8;
  p_03.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_stack_fffffffffffff5a0.memoryResource;
  local_2e8 = local_2f8;
  local_2e0 = local_2f0;
  VVar21 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588)
                      ,p_03);
  format = (PixelFormat)((ulong)pPVar12 >> 0x20);
  local_310 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar2._8_8_ = uVar18;
  auVar2._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_318 = vmovlpd_avx(auVar2);
  uVar18 = 0;
  v_03.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff5d0;
  v_03.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff5c8;
  local_308 = local_318;
  local_300 = local_310;
  local_2d8 = local_318;
  local_2d0 = local_310;
  TVar23 = (Tuple3<pbrt::Vector3,_float>)Normalize<float>(v_03);
  local_320 = TVar23.z;
  fVar26 = (float)uVar18;
  uStack_98c = (undefined4)((ulong)uVar18 >> 0x20);
  auVar1._8_4_ = fVar26;
  auVar1._0_8_ = TVar23._0_8_;
  auVar1._12_4_ = uStack_98c;
  local_328 = vmovlpd_avx(auVar1);
  local_330 = local_170;
  local_338 = local_178;
  local_340 = local_250;
  local_348 = local_258;
  local_350 = local_170;
  local_358 = local_178;
  v_09.super_Tuple3<pbrt::Vector3,_float>.z = local_170;
  v_09.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_178;
  v_09.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_178._4_4_;
  local_360 = local_250;
  local_368 = local_258;
  w_04.super_Tuple3<pbrt::Vector3,_float>.z = local_250;
  w_04.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_258;
  w_04.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_258._4_4_;
  local_2c8 = local_328;
  local_2c0 = local_320;
  fVar15 = Dot<float>(v_09,w_04);
  fVar15 = fVar15 + -1.0;
  std::abs(iVar14);
  if (0.001 < fVar15) {
LAB_008acaea:
    iVar14 = 0x3343056;
    Error<>((char *)in_stack_fffffffffffff5b0);
  }
  else {
    local_370 = local_1e0;
    local_378 = local_1e8;
    local_380 = local_2c0;
    local_388 = local_2c8;
    local_390 = local_1e0;
    local_398 = local_1e8;
    v_08.super_Tuple3<pbrt::Vector3,_float>.z = local_1e0;
    v_08.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_1e8;
    v_08.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1e8._4_4_;
    local_3a0 = local_2c0;
    local_3a8 = local_2c8;
    w_03.super_Tuple3<pbrt::Vector3,_float>.z = local_2c0;
    w_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_2c8;
    w_03.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_2c8._4_4_;
    fVar15 = Dot<float>(v_08,w_03);
    fVar15 = fVar15 + -1.0;
    std::abs(iVar14);
    if (0.001 < fVar15) goto LAB_008acaea;
  }
  local_3b0 = local_170;
  local_3b8 = local_178;
  local_3c0 = local_1e0;
  local_3c8 = local_1e8;
  local_3d0 = local_170;
  local_3d8 = local_178;
  v_07.super_Tuple3<pbrt::Vector3,_float>.z = local_170;
  v_07.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_178;
  v_07.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_178._4_4_;
  local_3e0 = local_1e0;
  local_3e8 = local_1e8;
  w_02.super_Tuple3<pbrt::Vector3,_float>.z = local_1e0;
  w_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_1e8;
  w_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1e8._4_4_;
  fVar16 = Dot<float>(v_07,w_02);
  fVar15 = fVar16;
  std::abs(iVar14);
  if (fVar16 <= 0.001) {
    local_3f0 = local_1e0;
    local_3f8 = local_1e8;
    local_400 = local_250;
    local_408 = local_258;
    local_410 = local_1e0;
    local_418 = local_1e8;
    v_06.super_Tuple3<pbrt::Vector3,_float>.z = local_1e0;
    v_06.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_1e8;
    v_06.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1e8._4_4_;
    local_420 = local_250;
    local_428 = local_258;
    w_01.super_Tuple3<pbrt::Vector3,_float>.z = local_250;
    w_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_258;
    w_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_258._4_4_;
    fVar17 = Dot<float>(v_06,w_01);
    in_stack_fffffffffffff648 = fVar17;
    std::abs(iVar14);
    if (fVar17 <= 0.001) {
      local_430 = local_250;
      local_438 = local_258;
      local_440 = local_2c0;
      local_448 = local_2c8;
      local_450 = local_250;
      local_458 = local_258;
      v_05.super_Tuple3<pbrt::Vector3,_float>.z = local_250;
      v_05.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_258;
      v_05.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_258._4_4_;
      local_460 = local_2c0;
      local_468 = local_2c8;
      w_00.super_Tuple3<pbrt::Vector3,_float>.z = local_2c0;
      w_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_2c8;
      w_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_2c8._4_4_;
      fVar17 = Dot<float>(v_05,w_00);
      std::abs(iVar14);
      if (fVar17 <= 0.001) {
        local_470 = local_2c0;
        local_478 = local_2c8;
        local_480 = local_170;
        local_488 = local_178;
        local_490 = local_2c0;
        local_498 = local_2c8;
        v_04.super_Tuple3<pbrt::Vector3,_float>.z = local_2c0;
        v_04.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_2c8;
        v_04.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_2c8._4_4_;
        local_4a0 = local_170;
        local_4a8 = local_178;
        w.super_Tuple3<pbrt::Vector3,_float>.z = local_170;
        w.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_178;
        w.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_178._4_4_;
        fVar17 = Dot<float>(v_04,w);
        std::abs(iVar14);
        if (fVar17 <= 0.001) goto LAB_008ace96;
      }
    }
  }
  Error<>((char *)in_stack_fffffffffffff5b0);
LAB_008ace96:
  local_4d0 = local_2c0;
  local_4d8 = local_2c8;
  local_4e0 = local_170;
  local_4e8 = local_178;
  local_4f0 = local_2c0;
  local_4f8 = local_2c8;
  local_500 = local_170;
  local_508 = local_178;
  x.super_Tuple3<pbrt::Vector3,_float>.z = fVar26;
  x.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)TVar23._0_8_;
  x.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)TVar23._0_8_ >> 0x20);
  y.super_Tuple3<pbrt::Vector3,_float>.y = fVar16;
  y.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff648;
  y.super_Tuple3<pbrt::Vector3,_float>.z = fVar15;
  Frame::FromXY(x,y);
  *(undefined4 *)(in_RDI + 0xe8) = local_4ac;
  *(undefined8 *)(in_RDI + 200) = local_4cc;
  *(undefined8 *)(in_RDI + 0xd0) = uStack_4c4;
  *(undefined8 *)(in_RDI + 0xd8) = uStack_4bc;
  *(undefined8 *)(in_RDI + 0xe0) = uStack_4b4;
  dxdA = (Tuple2<pbrt::Point2,_int>)Image::Resolution(in_RDX);
  this_01 = (Image *)local_628;
  alloc_00.memoryResource = (memory_resource *)local_631;
  local_631._1_8_ = this_01;
  local_5a8 = dxdA;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5c0,(char *)in_stack_fffffffffffff5b8,
             (allocator<char> *)in_stack_fffffffffffff5b0);
  local_631._1_8_ = local_628 + 0x20;
  domain = (Bounds2f *)&local_632;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5c0,(char *)in_stack_fffffffffffff5b8,
             (allocator<char> *)in_stack_fffffffffffff5b0);
  local_631._1_8_ = local_628 + 0x40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5c0,(char *)in_stack_fffffffffffff5b8,
             (allocator<char> *)in_stack_fffffffffffff5b0);
  local_5c8 = (Half *)local_628;
  local_5c0 = 3;
  v_00._M_array._4_4_ = in_stack_fffffffffffff58c;
  v_00._M_array._0_4_ = in_stack_fffffffffffff588;
  v_00._M_len = (size_type)in_stack_fffffffffffff590;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff580,v_00);
  Image::Encoding(in_stack_fffffffffffff578);
  PVar13.super_Tuple2<pbrt::Point2,_int>.y = (int)fVar20;
  PVar13.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff6d0;
  channels.n = in_stack_fffffffffffff6c8;
  channels.ptr = pbVar19;
  Image::Image((Image *)CONCAT44(TVar22.z,in_stack_fffffffffffff6b0),format,PVar13,channels,
               (ColorEncoding *)encoding,TVar22._0_8_);
  Image::operator=(in_stack_fffffffffffff580,local_8);
  Image::~Image(in_stack_fffffffffffff580);
  psVar25 = (string *)local_628;
  this_00 = (string *)&local_5c8;
  pIVar24 = local_8;
  do {
    this_00 = this_00 + -0x20;
    std::__cxx11::string::~string(this_00);
  } while (this_00 != psVar25);
  std::allocator<char>::~allocator(&local_633);
  std::allocator<char>::~allocator((allocator<char> *)&local_632);
  std::allocator<char>::~allocator((allocator<char> *)local_631);
  PVar13 = Image::Resolution((Image *)(in_RDI + 0xf0));
  iStack_64c = PVar13.super_Tuple2<pbrt::Point2,_int>.y;
  iVar14 = iStack_64c >> 0x1f;
  std::function<void(long)>::
  function<pbrt::PortalImageInfiniteLight::PortalImageInfiniteLight(pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*,float,std::__cxx11::string_const&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>,pstd::pmr::polymorphic_allocator<std::byte>)::__0,void>
            ((function<void_(long)> *)in_stack_fffffffffffff590,
             (anon_class_24_3_69b61c37 *)
             CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
  ParallelFor(CONCAT44(iVar14,iStack_64c),(int64_t)in_stack_fffffffffffff5c8,
              (function<void_(long)> *)in_stack_fffffffffffff5c0);
  std::function<void_(long)>::~function((function<void_(long)> *)0x8ad256);
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffff580,(float)((ulong)pIVar24 >> 0x20),
             SUB84(pIVar24,0));
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffff580,(float)((ulong)pIVar24 >> 0x20),
             SUB84(pIVar24,0));
  p2.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffff5ac;
  p2.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffff5a8;
  Bounds2<float>::Bounds2
            ((Bounds2<float> *)in_stack_fffffffffffff5a0.memoryResource,
             (Point2<float>)in_stack_fffffffffffff5b0,p2);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff580);
  Image::
  GetSamplingDistribution<pbrt::PortalImageInfiniteLight::PortalImageInfiniteLight(pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*,float,std::__cxx11::string_const&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>,pstd::pmr::polymorphic_allocator<std::byte>)::__1>
            (this_01,(anon_class_8_1_8991fb9c)dxdA,domain,alloc_00);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff580);
  Array2D<float>::Array2D
            ((Array2D<float> *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
             (Array2D<float> *)in_stack_fffffffffffff5a0.memoryResource,
             (allocator_type)in_stack_fffffffffffff5b0);
  WindowedPiecewiseConstant2D::WindowedPiecewiseConstant2D
            ((WindowedPiecewiseConstant2D *)
             CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
             (Array2D<float> *)in_stack_fffffffffffff5a0.memoryResource,
             (Allocator)in_stack_fffffffffffff5b0);
  WindowedPiecewiseConstant2D::operator=
            ((WindowedPiecewiseConstant2D *)in_stack_fffffffffffff580,
             (WindowedPiecewiseConstant2D *)pIVar24);
  WindowedPiecewiseConstant2D::~WindowedPiecewiseConstant2D
            ((WindowedPiecewiseConstant2D *)in_stack_fffffffffffff580);
  Array2D<float>::~Array2D((Array2D<float> *)in_stack_fffffffffffff590);
  Array2D<float>::~Array2D((Array2D<float> *)in_stack_fffffffffffff590);
  ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x8ad3ba);
  return;
}

Assistant:

PortalImageInfiniteLight::PortalImageInfiniteLight(
    const Transform &renderFromLight, Image equalAreaImage,
    const RGBColorSpace *imageColorSpace, Float scale, const std::string &filename,
    std::vector<Point3f> p, Allocator alloc)
    : LightBase(LightType::Infinite, renderFromLight, MediumInterface()),
      image(alloc),
      imageColorSpace(imageColorSpace),
      scale(scale),
      filename(filename),
      distribution(alloc) {
    ImageChannelDesc channelDesc = equalAreaImage.GetChannelDesc({"R", "G", "B"});
    if (!channelDesc)
        ErrorExit("%s: image used for PortalImageInfiniteLight doesn't have R, "
                  "G, B channels.",
                  filename);
    CHECK_EQ(3, channelDesc.size());
    CHECK(channelDesc.IsIdentity());

    if (equalAreaImage.Resolution().x != equalAreaImage.Resolution().y)
        ErrorExit("%s: image resolution (%d, %d) is non-square. It's unlikely "
                  "this is an equal area environment map.",
                  filename, equalAreaImage.Resolution().x, equalAreaImage.Resolution().y);

    if (p.size() != 4)
        ErrorExit("Expected 4 vertices for infinite light portal but given %d", p.size());
    for (int i = 0; i < 4; ++i)
        portal[i] = p[i];

    // PortalImageInfiniteLight constructor conclusion
    // Compute frame for portal coordinate system
    Vector3f p01 = Normalize(portal[1] - portal[0]);
    Vector3f p12 = Normalize(portal[2] - portal[1]);
    Vector3f p32 = Normalize(portal[2] - portal[3]);
    Vector3f p03 = Normalize(portal[3] - portal[0]);
    // Do opposite edges have the same direction?
    if (std::abs(Dot(p01, p32) - 1) > .001 || std::abs(Dot(p12, p03) - 1) > .001)
        Error("Infinite light portal isn't a planar quadrilateral");
    // Sides perpendicular?
    if (std::abs(Dot(p01, p12)) > .001 || std::abs(Dot(p12, p32)) > .001 ||
        std::abs(Dot(p32, p03)) > .001 || std::abs(Dot(p03, p01)) > .001)
        Error("Infinite light portal isn't a planar quadrilateral");
    portalFrame = Frame::FromXY(p03, p01);

    // Resample environment map into rectified image
    image = Image(PixelFormat::Float, equalAreaImage.Resolution(), {"R", "G", "B"},
                  equalAreaImage.Encoding(), alloc);
    ParallelFor(0, image.Resolution().y, [&](int y) {
        for (int x = 0; x < image.Resolution().x; ++x) {
            // Resample _equalAreaImage_ to compute rectified image pixel $(x,y)$
            // Find $(u,v)$ coordinates in equal-area image for pixel
            Point2f uv((x + 0.5f) / image.Resolution().x,
                       (y + 0.5f) / image.Resolution().y);
            Vector3f w = RenderFromImage(uv);
            w = Normalize(renderFromLight.ApplyInverse(w));
            Point2f uvEqui = EqualAreaSphereToSquare(w);

            for (int c = 0; c < 3; ++c) {
                Float v =
                    equalAreaImage.BilerpChannel(uvEqui, c, WrapMode::OctahedralSphere);
                image.SetChannel({x, y}, c, v);
            }
        }
    });

    // Initialize sampling distribution for portal image infinite light
    auto duv_dw = [&](Point2f p) {
        Float duv_dw;
        (void)RenderFromImage(p, &duv_dw);
        return duv_dw;
    };
    Array2D<Float> d = image.GetSamplingDistribution(duv_dw);
    distribution = WindowedPiecewiseConstant2D(d, alloc);
}